

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_junit_xml_generator.hpp
# Opt level: O2

bool iutest::JunitXmlGeneratorListener::SetUp(void)

{
  Variable *pVVar1;
  JunitXmlGeneratorListener *this;
  string xmlpath;
  
  TestEnv::get_report_junit_xml_filepath_abi_cxx11_();
  if (xmlpath._M_string_length != 0) {
    pVVar1 = TestEnv::get_vars();
    this = (JunitXmlGeneratorListener *)operator_new(0x50);
    JunitXmlGeneratorListener(this,&xmlpath);
    TestEventListeners::set_default_xml_generator
              (&pVVar1->m_event_listeners,(TestEventListener *)this);
  }
  std::__cxx11::string::~string((string *)&xmlpath);
  return xmlpath._M_string_length != 0;
}

Assistant:

static bool SetUp()
    {
        ::std::string xmlpath = TestEnv::get_report_junit_xml_filepath();
        if( !xmlpath.empty() )
        {
            TestEnv::event_listeners().set_default_xml_generator(new JunitXmlGeneratorListener(xmlpath));
            return true;
        }
        return false;
    }